

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void sse::BitwiseXor(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                    uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                    uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  undefined1 auVar8 [16];
  
  if (outY != outYEnd) {
    uVar4 = (ulong)totalSimdWidth;
    puVar5 = outY + uVar4;
    puVar6 = in2Y + uVar4;
    puVar7 = in1Y + uVar4;
    do {
      if (simdWidth != 0) {
        lVar3 = 0;
        do {
          puVar1 = (uint *)(in2Y + lVar3);
          puVar2 = (uint *)(in1Y + lVar3);
          auVar8._0_4_ = *puVar1 ^ *puVar2;
          auVar8._4_4_ = puVar1[1] ^ puVar2[1];
          auVar8._8_4_ = puVar1[2] ^ puVar2[2];
          auVar8._12_4_ = puVar1[3] ^ puVar2[3];
          *(undefined1 (*) [16])(outY + lVar3) = auVar8;
          lVar3 = lVar3 + 0x10;
        } while ((ulong)simdWidth << 4 != lVar3);
      }
      if (nonSimdWidth != 0) {
        uVar4 = 0;
        do {
          puVar5[uVar4] = puVar6[uVar4] ^ puVar7[uVar4];
          uVar4 = uVar4 + 1;
        } while (nonSimdWidth != uVar4);
      }
      outY = outY + rowSizeOut;
      in1Y = in1Y + rowSizeIn1;
      in2Y = in2Y + rowSizeIn2;
      puVar5 = puVar5 + rowSizeOut;
      puVar6 = puVar6 + rowSizeIn2;
      puVar7 = puVar7 + rowSizeIn1;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void BitwiseXor( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                     uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm_storeu_si128( dst, _mm_xor_si128( _mm_loadu_si128( src1 ), _mm_loadu_si128( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = (*in1X) ^ (*in2X);
            }
        }
    }